

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_game.cpp
# Opt level: O0

void G_AddViewAngle(int yaw)

{
  int local_c;
  int yaw_local;
  
  if (gamestate != GS_TITLELEVEL) {
    local_c = yaw << 0x10;
    if ((((&DAT_01ae70c8)[(long)consoleplayer * 0x2a0] != '\x01') &&
        (*(long *)(&DAT_01ae7190 + (long)consoleplayer * 0x2a0) != 0)) &&
       (0.0 < *(float *)(*(long *)(&DAT_01ae7190 + (long)consoleplayer * 0x2a0) + 0x598))) {
      local_c = (int)((float)local_c *
                     *(float *)(*(long *)(&DAT_01ae7190 + (long)consoleplayer * 0x2a0) + 0x598));
    }
    LocalViewAngle = LocalViewAngle - local_c;
    if (local_c != 0) {
      LocalKeyboardTurner = FBoolCVar::operator_cast_to_bool(&smooth_mouse);
    }
  }
  return;
}

Assistant:

void G_AddViewAngle (int yaw)
{
	if (gamestate == GS_TITLELEVEL)
	{
		return;
	}
	yaw <<= 16;
	if (players[consoleplayer].playerstate != PST_DEAD &&	// No adjustment while dead.
		players[consoleplayer].ReadyWeapon != NULL &&		// No adjustment if no weapon.
		players[consoleplayer].ReadyWeapon->FOVScale > 0)	// No adjustment if it is non-positive.
	{
		yaw = int(yaw * players[consoleplayer].ReadyWeapon->FOVScale);
	}
	LocalViewAngle -= yaw;
	if (yaw != 0)
	{
		LocalKeyboardTurner = smooth_mouse;
	}
}